

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O2

JavascriptMethod NativeCodeGenerator::CheckCodeGen(ScriptFunction *function)

{
  uint uVar1;
  NativeCodeGenerator *manager;
  bool bVar2;
  ExecutionMode EVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  FunctionBody *this;
  ScriptContext *this_00;
  ThreadContext *pTVar7;
  code *pcVar8;
  FunctionEntryPointInfo *pFVar9;
  FunctionEntryPointInfo *entryPointInfo;
  JobProcessor *pJVar10;
  ProxyEntryPointInfo *pPVar11;
  ProxyEntryPointInfo *pPVar12;
  
  if (function == (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x64f,"(function)","function");
    if (!bVar2) goto LAB_0058e81b;
    *puVar5 = 0;
  }
  p_Var6 = Js::RecyclableObject::GetEntryPoint((RecyclableObject *)function);
  if (p_Var6 != CheckCodeGenThunk) {
    p_Var6 = Js::RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    bVar2 = Js::CrossSite::IsThunk(p_Var6);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                         ,0x651,
                         "(function->GetEntryPoint() == NativeCodeGenerator::CheckCodeGenThunk || Js::CrossSite::IsThunk(function->GetEntryPoint()))"
                         ,
                         "function->GetEntryPoint() == NativeCodeGenerator::CheckCodeGenThunk || Js::CrossSite::IsThunk(function->GetEntryPoint())"
                        );
      if (!bVar2) goto LAB_0058e81b;
      *puVar5 = 0;
    }
  }
  this = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  this_00 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
  manager = this_00->nativeCodeGen;
  pTVar7 = this_00->threadContext;
  if (pTVar7->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x657,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "scriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar2) goto LAB_0058e81b;
    *puVar5 = 0;
    pTVar7 = this_00->threadContext;
  }
  if (pTVar7->callRootLevel == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x658,"(scriptContext->GetThreadContext()->IsInScript())",
                       "scriptContext->GetThreadContext()->IsInScript()");
    if (!bVar2) goto LAB_0058e81b;
    *puVar5 = 0;
  }
  pcVar8 = Js::FunctionProxy::GetOriginalEntryPoint((FunctionProxy *)this);
  pFVar9 = Js::ScriptFunction::GetFunctionEntryPointInfo(function);
  entryPointInfo = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(this);
  if (pFVar9 != entryPointInfo) {
    p_Var6 = Js::FunctionProxy::GetDirectEntryPoint
                       ((FunctionProxy *)this,(ProxyEntryPointInfo *)entryPointInfo);
    Js::ScriptFunction::UpdateThunkEntryPoint(function,entryPointInfo,p_Var6);
    p_Var6 = Js::FunctionProxy::GetDirectEntryPoint
                       ((FunctionProxy *)this,(ProxyEntryPointInfo *)entryPointInfo);
    pFVar9 = entryPointInfo;
    if (p_Var6 != CheckCodeGenThunk) {
      return p_Var6;
    }
  }
  if (((DAT_01441e58 == '\x01') &&
      (EVar3 = Js::FunctionBody::GetExecutionMode(this), EVar3 != SimpleJit)) &&
     (bVar2 = Js::FunctionBody::TryTransitionToJitExecutionMode(this), bVar2)) {
    pJVar10 = JsUtil::JobManager::Processor((JobManager *)manager);
    JsUtil::JobProcessor::PrioritizeJobAndWait<NativeCodeGenerator,Js::FunctionEntryPointInfo*>
              (pJVar10,manager,pFVar9,function);
LAB_0058e6ec:
    p_Var6 = CheckCodeGenDone(this,pFVar9,function);
    return p_Var6;
  }
  pJVar10 = JsUtil::JobManager::Processor((JobManager *)manager);
  bVar2 = JsUtil::JobProcessor::PrioritizeJob<NativeCodeGenerator,Js::FunctionEntryPointInfo*>
                    (pJVar10,manager,pFVar9,function);
  if (bVar2) goto LAB_0058e6ec;
  pPVar11 = Js::FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
  pPVar12 = Js::ScriptFunction::GetEntryPointInfo(function);
  if (pPVar11 == pPVar12) {
    if (((pcVar8 == Js::InterpreterStackFrame::StaticInterpreterThunk ||
          pcVar8 == Js::InterpreterStackFrame::DelayDynamicInterpreterThunk) ||
        (BVar4 = Js::ScriptContext::IsDynamicInterpreterThunk(this_00,pcVar8),
        pcVar8 == Js::JavascriptFunction::DeferredParsingThunk)) ||
       ((pcVar8 == Js::ScriptContext::ProfileModeDeferredParsingThunk || (BVar4 != 0))))
    goto LAB_0058e7ad;
    pFVar9 = Js::FunctionBody::GetSimpleJitEntryPointInfo(this);
    if (pFVar9 != (FunctionEntryPointInfo *)0x0) {
      pFVar9 = Js::FunctionBody::GetSimpleJitEntryPointInfo(this);
      p_Var6 = Js::EntryPointInfo::GetNativeEntrypoint(&pFVar9->super_EntryPointInfo);
      if (pcVar8 == p_Var6) goto LAB_0058e7ad;
    }
  }
  pFVar9 = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(this);
  uVar1 = pFVar9->entryPointIndex;
  pFVar9 = Js::ScriptFunction::GetFunctionEntryPointInfo(function);
  if (uVar1 <= pFVar9->entryPointIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x68f,
                       "(functionBody->GetDefaultEntryPointInfo() == function->GetEntryPointInfo() && ( originalEntryPoint == Js::InterpreterStackFrame::DelayDynamicInterpreterThunk || originalEntryPoint == Js::InterpreterStackFrame::StaticInterpreterThunk || scriptContext->IsDynamicInterpreterThunk(originalEntryPoint) || (originalEntryPoint == Js::ScriptContext::ProfileModeDeferredParsingThunk) || originalEntryPoint == Js::JavascriptFunction::DeferredParsingThunk || ( functionBody->GetSimpleJitEntryPointInfo() && originalEntryPoint == functionBody->GetSimpleJitEntryPointInfo()->GetNativeEntrypoint() ) ) || functionBody->GetDefaultFunctionEntryPointInfo()->entryPointIndex > function->GetFunctionEntryPointInfo()->entryPointIndex)"
                       ,
                       "functionBody->GetDefaultEntryPointInfo() == function->GetEntryPointInfo() && ( originalEntryPoint == DefaultEntryThunk || originalEntryPoint == Js::InterpreterStackFrame::StaticInterpreterThunk || scriptContext->IsDynamicInterpreterThunk(originalEntryPoint) || originalEntryPoint_IS_ProfileDeferredParsingThunk || originalEntryPoint == DefaultDeferredParsingThunk || ( functionBody->GetSimpleJitEntryPointInfo() && originalEntryPoint == functionBody->GetSimpleJitEntryPointInfo()->GetNativeEntrypoint() ) ) || functionBody->GetDefaultFunctionEntryPointInfo()->entryPointIndex > function->GetFunctionEntryPointInfo()->entryPointIndex"
                      );
    if (!bVar2) {
LAB_0058e81b:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar5 = 0;
  }
LAB_0058e7ad:
  if (this_00->CurrentThunk == Js::ScriptContext::DebugProfileProbeThunk) {
    pcVar8 = Js::ScriptContext::DebugProfileProbeThunk;
  }
  return pcVar8;
}

Assistant:

Js::JavascriptMethod
NativeCodeGenerator::CheckCodeGen(Js::ScriptFunction * function)
{
    Assert(function);
    Assert(function->GetEntryPoint() == NativeCodeGenerator::CheckCodeGenThunk
        || Js::CrossSite::IsThunk(function->GetEntryPoint()));
    // We are not expecting non-deserialized functions here; Error if it hasn't been deserialized by this point
    Js::FunctionBody *functionBody = function->GetFunctionBody();
    Js::ScriptContext *scriptContext = functionBody->GetScriptContext();

    NativeCodeGenerator *nativeCodeGen = scriptContext->GetNativeCodeGenerator();
    Assert(scriptContext->GetThreadContext()->IsScriptActive());
    Assert(scriptContext->GetThreadContext()->IsInScript());

    // Load the entry point here to validate it got changed afterwards
    Js::JavascriptMethod originalEntryPoint = functionBody->GetOriginalEntryPoint();
    Js::FunctionEntryPointInfo* entryPoint = function->GetFunctionEntryPointInfo();

    Js::FunctionEntryPointInfo *const defaultEntryPointInfo = functionBody->GetDefaultFunctionEntryPointInfo();
    if(entryPoint != defaultEntryPointInfo)
    {
        // Switch to the latest entry point info
        function->UpdateThunkEntryPoint(defaultEntryPointInfo, functionBody->GetDirectEntryPoint(defaultEntryPointInfo));

        const Js::JavascriptMethod defaultDirectEntryPoint = functionBody->GetDirectEntryPoint(defaultEntryPointInfo);
        if(!IsThunk(defaultDirectEntryPoint))
        {
            return defaultDirectEntryPoint;
        }
        entryPoint = defaultEntryPointInfo;
    }

    // If a transition to JIT needs to be forced, JIT right away
    if(Js::Configuration::Global.flags.EnforceExecutionModeLimits &&
        functionBody->GetExecutionMode() != ExecutionMode::SimpleJit &&
        functionBody->TryTransitionToJitExecutionMode())
    {
        nativeCodeGen->Processor()->PrioritizeJobAndWait(nativeCodeGen, entryPoint, function);
        return CheckCodeGenDone(functionBody, entryPoint, function);
    }

    if(!nativeCodeGen->Processor()->PrioritizeJob(nativeCodeGen, entryPoint, function))
    {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
#define originalEntryPoint_IS_ProfileDeferredParsingThunk \
            (originalEntryPoint == ProfileDeferredParsingThunk)
#else
#define originalEntryPoint_IS_ProfileDeferredParsingThunk \
            false
#endif
        // Job was not yet processed
        // originalEntryPoint is the last known good entry point for the function body. Here we verify that
        // it either corresponds with this codegen episode (identified by function->entryPointIndex) of the function body
        // or one that was scheduled after. In the latter case originalEntryPoint will get updated if and when
        // that last episode completes successfully.
        Assert(functionBody->GetDefaultEntryPointInfo() == function->GetEntryPointInfo() &&
            (
                originalEntryPoint == DefaultEntryThunk
             || originalEntryPoint == Js::InterpreterStackFrame::StaticInterpreterThunk
             || scriptContext->IsDynamicInterpreterThunk(originalEntryPoint)
             || originalEntryPoint_IS_ProfileDeferredParsingThunk
             || originalEntryPoint == DefaultDeferredParsingThunk
             || (
                    functionBody->GetSimpleJitEntryPointInfo() &&
                    originalEntryPoint == functionBody->GetSimpleJitEntryPointInfo()->GetNativeEntrypoint()
                )
            ) ||
            functionBody->GetDefaultFunctionEntryPointInfo()->entryPointIndex > function->GetFunctionEntryPointInfo()->entryPointIndex);
        return (scriptContext->CurrentThunk == ProfileEntryThunk) ? ProfileEntryThunk : originalEntryPoint;
    }

    return CheckCodeGenDone(functionBody, entryPoint, function);
}